

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O1

bool __thiscall Omega_h::HostWrite<int>::exists(HostWrite<int> *this)

{
  return (this->write_).shared_alloc_.direct_ptr != (void *)0x0;
}

Assistant:

OMEGA_H_INLINE bool exists() const noexcept {
#if defined(OMEGA_H_USE_KOKKOS)
    return view().data() != nullptr
#if defined(KOKKOS_ENABLE_DEPRECATED_CODE) && (!defined(__CUDA_ARCH__))
           /* deprecated Kokkos behavior: zero-span views have data()==nullptr
            */
           || view().use_count() != 0
#endif
        ;
#else
    return shared_alloc_.data() != nullptr;
#endif
  }